

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

void __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
setExtentedRanges(HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
                  *this,PrimInfoExtRange *set,PrimInfoExtRange *lset,PrimInfoExtRange *rset,
                 size_t lweight,size_t rweight)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  
  uVar2 = (set->super_extended_range<unsigned_long>)._ext_end -
          (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  fVar3 = floorf(((float)lweight / (float)(rweight + lweight)) * (float)uVar2);
  uVar1 = (long)(fVar3 - 9.223372e+18) & (long)fVar3 >> 0x3f | (long)fVar3;
  if (uVar2 <= uVar1) {
    uVar1 = uVar2;
  }
  (lset->super_extended_range<unsigned_long>)._ext_end =
       (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end + uVar1;
  (rset->super_extended_range<unsigned_long>)._ext_end =
       (uVar2 + (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end) - uVar1
  ;
  return;
}

Assistant:

__noinline void setExtentedRanges(const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset, const size_t lweight, const size_t rweight)
        {
          assert(set.ext_range_size() > 0);
          const float left_factor           = (float)lweight / (lweight + rweight);
          const size_t ext_range_size       = set.ext_range_size();
          const size_t left_ext_range_size  = min((size_t)(floorf(left_factor * ext_range_size)),ext_range_size);
          const size_t right_ext_range_size = ext_range_size - left_ext_range_size;
          lset.set_ext_range(lset.end() + left_ext_range_size);
          rset.set_ext_range(rset.end() + right_ext_range_size);
        }